

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quota_lessor.c
# Opt level: O0

void test_hard_lease(void)

{
  ssize_t sVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 local_30 [8];
  quota_lessor l;
  size_t quota_total;
  quota q;
  
  plan(0xc);
  _space(_stdout);
  printf("# *** %s ***\n","test_hard_lease");
  l.leased = 0x120000;
  quota_init((quota *)&quota_total,0x120000);
  quota_lessor_create((quota_lessor *)local_30,(quota *)&quota_total);
  sVar1 = quota_lease((quota_lessor *)local_30,0x100000);
  _ok((uint)(sVar1 == 0x100000),"QUOTA_USE_MIN == quota_lease(&l, QUOTA_USE_MIN)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x49
      ,"lease 1Mb");
  sVar2 = quota_available((quota_lessor *)local_30);
  _ok((uint)(sVar2 == 0),"0 == quota_available(&l)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x4a
      ,"available 0");
  sVar2 = quota_leased((quota_lessor *)local_30);
  _ok((uint)(sVar2 == 0x100000),"QUOTA_USE_MIN == quota_leased(&l)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x4b
      ,"leased 1Mb");
  sVar2 = quota_used((quota *)&quota_total);
  _ok((uint)(sVar2 == 0x100000),"QUOTA_USE_MIN == quota_used(&q)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x4c
      ,"source quota used");
  sVar1 = quota_lease((quota_lessor *)local_30,0x100000);
  _ok((uint)(sVar1 == -1),"-1 == quota_lease(&l, QUOTA_USE_MIN)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x4e
      ,"lease too big");
  sVar1 = quota_lease((quota_lessor *)local_30,0x400);
  _ok((uint)(sVar1 == 0x400),"QUOTA_UNIT_SIZE == quota_lease(&l, QUOTA_UNIT_SIZE)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x50
      ,"hard lease");
  sVar2 = quota_leased((quota_lessor *)local_30);
  _ok((uint)(sVar2 == 0x100400),"QUOTA_UNIT_SIZE + QUOTA_USE_MIN == quota_leased(&l)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x52
      ,"leased changed");
  sVar2 = quota_available((quota_lessor *)local_30);
  _ok((uint)(sVar2 == 0x1fc00),"QUOTA_USE_MIN / 8 - QUOTA_UNIT_SIZE == quota_available(&l)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x54
      ,"available the part of 1MB");
  sVar2 = l.leased;
  sVar3 = quota_used((quota *)&quota_total);
  _ok((uint)(sVar2 == sVar3),"quota_total == quota_used(&q)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x55
      ,"source quota fully used");
  sVar2 = quota_leased((quota_lessor *)local_30);
  quota_end_lease((quota_lessor *)local_30,sVar2);
  quota_lessor_destroy((quota_lessor *)local_30);
  sVar2 = quota_available((quota_lessor *)local_30);
  _ok((uint)(sVar2 == 0),"0 == quota_available(&l)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x5a
      ,"lessor is empty");
  sVar2 = quota_leased((quota_lessor *)local_30);
  _ok((uint)(sVar2 == 0),"0 == quota_leased(&l)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x5b
      ,"lessor is empty");
  sVar2 = quota_used((quota *)&quota_total);
  _ok((uint)(sVar2 == 0),"0 == quota_used(&q)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x5c
      ,"sourcr quota is empty");
  _space(_stdout);
  printf("# *** %s: done ***\n","test_hard_lease");
  check_plan();
  return;
}

Assistant:

void
test_hard_lease()
{
	plan(12);
	header();

	struct quota q;
	size_t quota_total = QUOTA_USE_MIN + QUOTA_USE_MIN / 8;
	quota_init(&q, quota_total);
	struct quota_lessor l;
	quota_lessor_create(&l, &q);
	is(QUOTA_USE_MIN, quota_lease(&l, QUOTA_USE_MIN), "lease 1Mb");
	is(0, quota_available(&l), "available 0");
	is(QUOTA_USE_MIN, quota_leased(&l), "leased 1Mb");
	is(QUOTA_USE_MIN, quota_used(&q), "source quota used");

	is(-1, quota_lease(&l, QUOTA_USE_MIN), "lease too big");

	is(QUOTA_UNIT_SIZE, quota_lease(&l, QUOTA_UNIT_SIZE), "hard lease");

	is(QUOTA_UNIT_SIZE + QUOTA_USE_MIN, quota_leased(&l), "leased changed");
	is(QUOTA_USE_MIN / 8 - QUOTA_UNIT_SIZE, quota_available(&l),
	   "available the part of 1MB");
	is(quota_total, quota_used(&q), "source quota fully used");

	quota_end_lease(&l, quota_leased(&l));

	quota_lessor_destroy(&l);
	is(0, quota_available(&l), "lessor is empty");
	is(0, quota_leased(&l), "lessor is empty");
	is(0, quota_used(&q), "sourcr quota is empty");

	footer();
	check_plan();
}